

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

knot_style ON_KnotVectorStyle(int order,int cv_count,double *knot)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  knot_style kVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  kVar5 = unknown_knot_style;
  if ((1 < order) && (knot != (double *)0x0 && order <= cv_count)) {
    if (knot[(ulong)(uint)order - 2] < knot[cv_count - 1U]) {
      uVar8 = (ulong)(order - 1);
      dVar9 = ((knot[cv_count - 1U] - knot[(ulong)(uint)cv_count - 2]) +
              (knot[uVar8] - knot[(ulong)(uint)order - 2])) * 0.5;
      bVar4 = ON_IsKnotVectorClamped(order,cv_count,knot,2);
      if (bVar4) {
        kVar5 = piecewise_bezier_knots;
        uVar6 = uVar8;
        if (order != cv_count) {
          do {
            if ((uint)cv_count <= uVar6) {
              return quasi_uniform_knots;
            }
            pdVar1 = knot + uVar6;
            lVar7 = uVar6 - 1;
            uVar6 = uVar6 + 1;
          } while (ABS((*pdVar1 - knot[lVar7]) - dVar9) <= dVar9 * 1e-06);
          lVar7 = 0;
          do {
            if ((long)(int)(cv_count - 1U) <= (long)(uVar8 + lVar7)) {
              return piecewise_bezier_knots;
            }
            lVar2 = uVar8 + lVar7;
            lVar3 = lVar7 + -1;
          } while ((knot[lVar2] == knot[uVar8 * 2 + lVar3]) &&
                  (lVar7 = uVar8 + lVar7, !NAN(knot[lVar2]) && !NAN(knot[uVar8 * 2 + lVar3])));
          kVar5 = clamped_end_knots;
        }
      }
      else {
        lVar7 = 1;
        do {
          if (order + cv_count + -2 <= lVar7) {
            return uniform_knots;
          }
          pdVar1 = knot + lVar7;
          lVar2 = lVar7 + -1;
          lVar7 = lVar7 + 1;
        } while (ABS((*pdVar1 - knot[lVar2]) - dVar9) <= dVar9 * 1e-06);
        kVar5 = non_uniform_knots;
      }
    }
  }
  return kVar5;
}

Assistant:

ON::knot_style ON_KnotVectorStyle( 
       int order,
       int cv_count,
       const double* knot
       )
{
  ON::knot_style s = ON::unknown_knot_style;
  if ( order >= 2 && cv_count >= order && knot && knot[order-2] < knot[cv_count-1] ) {
    const int knot_count = order+cv_count-2;
    const double delta = 0.5*((knot[order-1] - knot[order-2]) + (knot[cv_count-1] - knot[cv_count-2]));
    const double ktol = delta*1.0e-6;
    int i;
    if ( ON_IsKnotVectorClamped( order, cv_count, knot ) ) {
      if ( order == cv_count ) {
        s = ON::piecewise_bezier_knots;
      }
      else {
        s = ON::clamped_end_knots;
        for ( i = order-1; i <= cv_count-1; i++ ) {
          if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
            break;
          }
        }
        if ( i >= cv_count ) {
          s = ON::quasi_uniform_knots;
        }
        else {
          const int degree = order-1;
          for ( i = order-1; i < cv_count-1; i += degree ) {
            if ( knot[i] != knot[i+degree-1] )
              break; 
          }
          if ( i >= cv_count-1 )
            s = ON::piecewise_bezier_knots;
        }
      }
    }
    else {
      // check for uniform knots
      s = ON::non_uniform_knots;
      for ( i = 1; i < knot_count; i++ ) {
        if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
          break;
        }
      }
      if ( i >= knot_count )
        s = ON::uniform_knots; 
    }
  }
  return s;
}